

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::RunContext
          (RunContext *this,Ptr<const_Catch::IConfig> *_config,
          Ptr<Catch::IStreamingReporter> *reporter)

{
  IConfig *pIVar1;
  IMutableContext *pIVar2;
  IStreamingReporter *pIVar3;
  Ptr<const_Catch::IConfig> *in_RSI;
  IResultCapture *in_RDI;
  string *in_stack_ffffffffffffff48;
  Totals *in_stack_ffffffffffffff50;
  TrackerContext *this_00;
  AssertionResult *in_stack_ffffffffffffff60;
  string local_38 [40];
  Ptr<const_Catch::IConfig> *local_10;
  
  local_10 = in_RSI;
  IResultCapture::IResultCapture(in_RDI);
  IRunner::IRunner((IRunner *)(in_RDI + 1));
  in_RDI->_vptr_IResultCapture = (_func_int **)&PTR__RunContext_00238f58;
  in_RDI[1]._vptr_IResultCapture = (_func_int **)&DAT_00238fc8;
  pIVar1 = Ptr<const_Catch::IConfig>::operator->(local_10);
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_38);
  TestRunInfo::TestRunInfo((TestRunInfo *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_38);
  pIVar2 = getCurrentMutableContext();
  in_RDI[6]._vptr_IResultCapture = (_func_int **)pIVar2;
  in_RDI[7]._vptr_IResultCapture = (_func_int **)0x0;
  AssertionResult::AssertionResult(in_stack_ffffffffffffff60);
  Ptr<const_Catch::IConfig>::Ptr
            ((Ptr<const_Catch::IConfig> *)in_stack_ffffffffffffff50,
             (Ptr<const_Catch::IConfig> *)in_stack_ffffffffffffff48);
  Totals::Totals(in_stack_ffffffffffffff50);
  Ptr<Catch::IStreamingReporter>::Ptr
            ((Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff50,
             (Ptr<Catch::IStreamingReporter> *)in_stack_ffffffffffffff48);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x1a928c);
  AssertionInfo::AssertionInfo(&in_stack_ffffffffffffff60->m_info);
  this_00 = (TrackerContext *)(in_RDI + 0x3a);
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::vector
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)0x1a92ba);
  std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::vector((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            *)0x1a92d0);
  TestCaseTracking::TrackerContext::TrackerContext(this_00);
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x40))(in_RDI[6]._vptr_IResultCapture,in_RDI + 1);
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x48))
            (in_RDI[6]._vptr_IResultCapture,in_RDI + 0x21);
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x38))();
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x28));
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(pIVar3,in_RDI + 2);
  return;
}

Assistant:

explicit RunContext( Ptr<IConfig const> const& _config, Ptr<IStreamingReporter> const& reporter )
        :   m_runInfo( _config->name() ),
            m_context( getCurrentMutableContext() ),
            m_activeTestCase( CATCH_NULL ),
            m_config( _config ),
            m_reporter( reporter )
        {
            m_context.setRunner( this );
            m_context.setConfig( m_config );
            m_context.setResultCapture( this );
            m_reporter->testRunStarting( m_runInfo );
        }